

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Frame.cpp
# Opt level: O2

void __thiscall IRT::CFrame::CFrame(CFrame *this,string *_className,string *_methodName)

{
  CAddressInRegister *pCVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__cxx11::string::string((string *)this,(string *)_className);
  std::__cxx11::string::string((string *)&this->methodName,(string *)_methodName);
  std::operator+(&local_b0,&this->className,"$");
  std::operator+(&local_50,&local_b0,&this->methodName);
  CLabel::CLabel(&this->name,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_b0);
  (this->localVisibilityAddresses)._M_h._M_buckets =
       &(this->localVisibilityAddresses)._M_h._M_single_bucket;
  (this->localVisibilityAddresses)._M_h._M_bucket_count = 1;
  (this->localVisibilityAddresses)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->localVisibilityAddresses)._M_h._M_element_count = 0;
  (this->localVisibilityAddresses)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->localVisibilityAddresses)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->localVisibilityAddresses)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->classFieldAddresses)._M_h._M_buckets = &(this->classFieldAddresses)._M_h._M_single_bucket;
  (this->classFieldAddresses)._M_h._M_bucket_count = 1;
  (this->classFieldAddresses)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->classFieldAddresses)._M_h._M_element_count = 0;
  (this->classFieldAddresses)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->classFieldAddresses)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->classFieldAddresses)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->maxOffsetFramePointer = 0;
  this->maxOffsetThis = 0;
  pCVar1 = (CAddressInRegister *)operator_new(0x28);
  std::__cxx11::string::string((string *)&local_70,(string *)&framePointerAddressName_abi_cxx11_);
  CTemp::CTemp((CTemp *)&local_b0,&local_70);
  CAddressInRegister::CAddressInRegister(pCVar1,(CTemp *)&local_b0);
  addAddress(this,&framePointerAddressName_abi_cxx11_,(IAddress *)pCVar1);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_70);
  pCVar1 = (CAddressInRegister *)operator_new(0x28);
  std::__cxx11::string::string((string *)&local_90,(string *)&returnValueAddressName_abi_cxx11_);
  CTemp::CTemp((CTemp *)&local_b0,&local_90);
  CAddressInRegister::CAddressInRegister(pCVar1,(CTemp *)&local_b0);
  addAddress(this,&returnValueAddressName_abi_cxx11_,(IAddress *)pCVar1);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_90);
  return;
}

Assistant:

CFrame::CFrame(const std::string &_className, const std::string &_methodName)
        : className(_className), methodName(_methodName), name(className + "$" + methodName),
          maxOffsetFramePointer(0), maxOffsetThis(0) {
    addAddress(framePointerAddressName, new CAddressInRegister(CTemp(framePointerAddressName)));
    addAddress(returnValueAddressName, new CAddressInRegister(CTemp(returnValueAddressName)));
}